

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

reentrant_put_transaction<void> *
density_tests::detail::
PutInt<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::
reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
             conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
             *i_queue,EasyRandom *param_2)

{
  int local_54;
  reentrant_put_transaction<int> local_50;
  undefined1 local_38 [8];
  reentrant_put_transaction<int>_conflict1 transaction;
  EasyRandom *param_1_local;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *i_queue_local;
  
  local_54 = 1;
  transaction.m_put_data.m_user_storage = param_2;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_50,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             i_queue,&local_54);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<int>::reentrant_put_transaction<int,void>
            ((reentrant_put_transaction<int> *)local_38,&local_50);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_50);
  exception_checkpoint();
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::reentrant_put_transaction<int,void>
            ((reentrant_put_transaction<void> *)__return_storage_ptr__,
             (reentrant_put_transaction<int>_conflict *)local_38);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction
            ((reentrant_put_transaction<int> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                auto transaction = i_queue.start_reentrant_push(1);
                exception_checkpoint();
                return std::move(transaction);
            }